

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallRef(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  IString *pIVar2;
  uint32_t uVar3;
  Expression *pEVar4;
  Type *pTVar5;
  uintptr_t *puVar6;
  RefFunc *target;
  CallRef *pCVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  size_t extraout_RDX_01;
  long lVar8;
  bool isReturn;
  Type local_80;
  Expression *local_78;
  Random *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 local_48 [8];
  Iterator __begin1;
  
  local_70 = &this->random;
  lVar8 = 10;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type.id;
  do {
    pMVar1 = this->wasm;
    if (*(long *)(pMVar1 + 0x18) == *(long *)(pMVar1 + 0x20)) break;
    uVar3 = Random::upTo(local_70,(uint32_t)
                                  ((ulong)(*(long *)(pMVar1 + 0x20) - *(long *)(pMVar1 + 0x18)) >> 3
                                  ));
    pIVar2 = *(IString **)(*(long *)(pMVar1 + 0x18) + (ulong)uVar3 * 8);
    if ((__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index == 1) &&
       (((byte)this->wasm[0x108] & 0x80) != 0)) {
      wasm::HeapType::getSignature();
      wasm::HeapType::getSignature();
      isReturn = extraout_RDX == extraout_RDX_00;
    }
    else {
      isReturn = false;
    }
    wasm::HeapType::getSignature();
    if ((isReturn != false) ||
       (extraout_RDX_01 ==
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)) {
      auStack_68 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.id = wasm::HeapType::getSignature();
      local_48 = (undefined1  [8])&local_80;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      pTVar5 = (Type *)wasm::Type::size();
      if (pTVar5 != (Type *)0x0) {
        do {
          do {
            puVar6 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_48);
            local_78 = make(this,(Type)*puVar6);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                       &local_78);
            __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent != pTVar5);
        } while (local_48 != (undefined1  [8])&local_80);
      }
      target = Builder::makeRefFunc
                         (&this->builder,(Name)pIVar2->str,
                          (HeapType)*(uintptr_t *)((long)(pIVar2 + 3) + 8));
      pCVar7 = Builder::
               makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,(Expression *)target,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68,
                          (Type)__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index,isReturn);
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
      return (Expression *)pCVar7;
    }
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  pEVar4 = makeTrivial(this,(Type)__begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallRef(Type type) {
  // look for a call target with the right type
  Function* target;
  bool isReturn;
  size_t i = 0;
  while (1) {
    if (i == TRIES || wasm.functions.empty()) {
      // We can't find a proper target, give up.
      return makeTrivial(type);
    }
    // TODO: handle unreachable
    target = wasm.functions[upTo(wasm.functions.size())].get();
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() == type || isReturn) {
      break;
    }
    i++;
  }
  std::vector<Expression*> args;
  for (const auto& type : target->getParams()) {
    args.push_back(make(type));
  }
  // TODO: half the time make a completely random item with that type.
  return builder.makeCallRef(
    builder.makeRefFunc(target->name, target->type), args, type, isReturn);
}